

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmelSWITypes.cpp
# Opt level: O2

U8 __thiscall SWI_WaveParser::GetByte(SWI_WaveParser *this,U64 *smplBegin,U64 *smplEnd,bool *isWake)

{
  SWI_Token SVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  U64 locBegin;
  bool *local_38;
  
  *isWake = false;
  bVar3 = 0;
  local_38 = isWake;
  iVar4 = 8;
  do {
    iVar2 = iVar4 + -1;
    if (iVar4 == 0) {
      return bVar3;
    }
    bVar3 = bVar3 >> 1;
    SVar1 = GetToken(this,&locBegin,smplEnd);
    if (SVar1 == SWI_One) {
      bVar3 = bVar3 | 0x80;
    }
    else if (SVar1 == SWI_Wake) {
      *smplBegin = locBegin;
      *local_38 = true;
      return '\0';
    }
    bVar5 = iVar4 == 8;
    iVar4 = iVar2;
    if (bVar5) {
      *smplBegin = locBegin;
    }
  } while( true );
}

Assistant:

U8 SWI_WaveParser::GetByte( U64& smplBegin, U64& smplEnd, bool& isWake )
{
    U8 ret_val = 0;
    int b;
    SWI_Token t;
    U64 locBegin;

    isWake = false;

    for( b = 0; b < 8; b++ )
    {
        ret_val >>= 1;

        t = GetToken( locBegin, smplEnd );

        if( t == SWI_One )
            ret_val |= ( 1 << 7 );
        else if( t == SWI_Wake )
        {
            smplBegin = locBegin;
            isWake = true;
            return 0;
        }

        if( b == 0 )
            smplBegin = locBegin;
    }

    return ret_val;
}